

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O0

TPZFMatrix<long> * __thiscall TPZFMatrix<long>::operator=(TPZFMatrix<long> *this,long value)

{
  long lVar1;
  long lVar2;
  int64_t i;
  long *dst;
  int64_t size;
  long value_local;
  TPZFMatrix<long> *this_local;
  
  lVar1 = (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow;
  lVar2 = (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol;
  dst = this->fElem;
  for (i = 0; i < lVar1 * lVar2; i = i + 1) {
    *dst = value;
    dst = dst + 1;
  }
  (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fDecomposed = '\0';
  return this;
}

Assistant:

TPZFMatrix<TVar>& TPZFMatrix<TVar>::operator=(const TVar value ) {
    int64_t size = ((int64_t)this->fRow) * this->fCol;
    TVar * dst   = fElem;
    for ( int64_t i = 0; i < size; i++ )
        *dst++ = value;
    this->fDecomposed = 0;
    return *this;
}